

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.cpp
# Opt level: O0

Util * __thiscall Util::toString_abi_cxx11_(Util *this,ImageScaleType scaleType)

{
  allocator local_29;
  allocator local_28;
  allocator local_27;
  allocator local_26;
  allocator local_25 [16];
  allocator local_15;
  ImageScaleType local_14;
  Util *pUStack_10;
  ImageScaleType scaleType_local;
  
  local_14 = scaleType;
  pUStack_10 = this;
  switch(scaleType) {
  case ScaleCenter:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"ScaleCenter",local_25);
    std::allocator<char>::~allocator((allocator<char> *)local_25);
    break;
  case ScaleStretch:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"ScaleStretch",&local_28);
    std::allocator<char>::~allocator((allocator<char> *)&local_28);
    break;
  case ScaleAspectInside:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"ScaleAspectInside",&local_15);
    std::allocator<char>::~allocator((allocator<char> *)&local_15);
    break;
  case ScaleAspectOutside:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"ScaleAspectOutside",&local_26);
    std::allocator<char>::~allocator((allocator<char> *)&local_26);
    break;
  case ScaleNinePatch:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"ScaleNinePatch",&local_27);
    std::allocator<char>::~allocator((allocator<char> *)&local_27);
    break;
  default:
    std::allocator<char>::allocator();
    std::__cxx11::string::string((string *)this,"UNSUPPORTED",&local_29);
    std::allocator<char>::~allocator((allocator<char> *)&local_29);
  }
  return this;
}

Assistant:

std::string Util::toString(ImageScaleType scaleType)
{
	switch (scaleType)
	{
	case ScaleAspectInside:
		return "ScaleAspectInside";
	case ScaleCenter:
		return "ScaleCenter";
	case ScaleAspectOutside:
		return "ScaleAspectOutside";
	case ScaleNinePatch:
		return "ScaleNinePatch";
	case ScaleStretch:
		return "ScaleStretch";
	default:
		return "UNSUPPORTED";
	}
}